

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *stream,QJsonDocument *doc)

{
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> _Var1;
  long in_FS_OFFSET;
  QJsonParseError parseError;
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> local_48;
  QJsonParseError local_40;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char *)0x0;
  local_38.d.size = 0;
  operator>>(stream,&local_38);
  local_40.offset = -1;
  local_40.error = NoError;
  QJsonDocument::fromJson((QJsonDocument *)&local_48,&local_38,&local_40);
  _Var1._M_head_impl =
       (doc->d)._M_t.
       super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
       super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
  (doc->d)._M_t.
  super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
  super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = _Var1._M_head_impl;
  QJsonDocument::~QJsonDocument((QJsonDocument *)&local_48);
  if ((local_40.error != NoError) && (local_38.d.size != 0)) {
    QDataStream::setStatus(stream,ReadCorruptData);
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QJsonDocument &doc)
{
    QByteArray buffer;
    stream >> buffer;
    QJsonParseError parseError{};
    doc = QJsonDocument::fromJson(buffer, &parseError);
    if (parseError.error && !buffer.isEmpty())
        stream.setStatus(QDataStream::ReadCorruptData);
    return stream;
}